

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

PolicyPureVector * __thiscall
PolicyPureVector::operator=(PolicyPureVector *this,PolicyPureVector *o)

{
  PolicyPureVector *in_RSI;
  PolicyPureVector *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000078;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000080;
  PolicyDiscretePure *in_stack_ffffffffffffffd8;
  PolicyPureVector *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    PolicyDiscretePure::operator=(&in_RDI->super_PolicyDiscretePure,in_stack_ffffffffffffffd8);
    *(undefined4 *)&(in_RDI->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34 =
         *(undefined4 *)&(in_RSI->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (in_stack_00000080,in_stack_00000078);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

PolicyPureVector& PolicyPureVector::operator= (const PolicyPureVector& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    PolicyDiscretePure::operator= ( o );
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices = o._m_domainToActionIndices;

    return *this;
}